

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O2

int trdmain(int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  int iVar1;
  uint uVar2;
  osfildef *fp;
  long lVar3;
  char *pcVar4;
  errdef fr_;
  errcxdef errctx;
  
  errctx.errcxlog = trdlogerr;
  errctx.errcxfp = (osfildef *)0x0;
  errctx.errcxofs = 0;
  errctx.errcxlgc = &errctx;
  errctx.errcxappctx = appctx;
  fp = oserrop(*argv);
  errini(&errctx,fp);
  lVar3 = 1;
  do {
    if (argc <= lVar3) {
      trdptf("%s - A %s TADS %s Interpreter.\n",G_tads_oem_app_name,G_tads_oem_display_mode,"2.5.17"
            );
      pcVar4 = "TADS c";
      if (G_tads_oem_copyright_prefix == 0) {
        pcVar4 = "C";
      }
      trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",pcVar4);
      trdptf("%s\n",G_tads_oem_author);
      break;
    }
    iVar1 = strcmp(argv[lVar3],"-nobanner");
    lVar3 = lVar3 + 1;
  } while (iVar1 != 0);
  iVar1 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  fr_.errcode = iVar1;
  if (iVar1 == 0) {
    fr_.errprv = errctx.errcxptr;
    errctx.errcxptr = &fr_;
    trdmain1(&errctx,argc,argv,appctx,save_ext);
    errctx.errcxptr = fr_.errprv;
    if (errctx.errcxfp != (osfildef *)0x0) {
      fclose((FILE *)errctx.errcxfp);
    }
    close_log_files();
    uVar2 = 0;
  }
  else {
    errctx.errcxptr = fr_.errprv;
    if ((iVar1 != 0x3f9) && (iVar1 != 0x5dc)) {
      (*errctx.errcxlog)(errctx.errcxlgc,fr_.errfac,iVar1,fr_.erraac,fr_.erraav);
    }
    if (errctx.errcxfp != (osfildef *)0x0) {
      fclose((FILE *)errctx.errcxfp);
    }
    close_log_files();
    os_expause();
    uVar2 = (uint)(iVar1 != 0x3f9);
  }
  return uVar2;
}

Assistant:

int trdmain(int argc, char *argv[], appctxdef *appctx, char *save_ext)
{
    errcxdef  errctx;
    int       err;
	osfildef *fp;
	int       banner = TRUE;                            /* show the banner? */
	int       i;

	VARUSED(banner);

	/* set up the error handler */
    errctx.errcxlog = trdlogerr;
    errctx.errcxlgc = &errctx;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxofs = 0;
    errctx.errcxappctx = appctx;
    fp = oserrop(argv[0]);
	errini(&errctx, fp);

	/* check for the -nobanner option */
	for (i = 1 ; i < argc ; ++i)
	{
		if (strcmp(argv[i], "-nobanner") == 0)
		{
			banner = FALSE;
			break;
		}
	}
    
    /* copyright-date-string */
#ifndef NO_T2_COPYRIGHT_NOTICE
	if (banner)
	{
		trdptf("%s - A %s TADS %s Interpreter.\n",
			   G_tads_oem_app_name, G_tads_oem_display_mode,
			   TADS_RUNTIME_VERSION);
		trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",
			   G_tads_oem_copyright_prefix ? "TADS c" : "C");
		trdptf("%s\n", G_tads_oem_author);
	}
#endif
    
    ERRBEGIN(&errctx)
        trdmain1(&errctx, argc, argv, appctx, save_ext);
    ERRCATCH(&errctx, err)
        /* 
         *   log the error, unless it's usage (in which case we logged it
         *   already) or we're simply quitting the game 
         */
        if (err != ERR_USAGE && err != ERR_RUNQUIT)
            errclog(&errctx);
    
        /* close the error file */
        if (errctx.errcxfp != 0)
			osfcls(errctx.errcxfp);

		/* close the command and log files, if open */
		close_log_files();

        /* pause before exiting if the OS desires it */
        os_expause();

        /* return failure unless we're simply quitting the game */
        return (err == ERR_RUNQUIT ? OSEXSUCC : OSEXFAIL);
    ERREND(&errctx)
        
    /* close the error file if we opened it */
    if (errctx.errcxfp != 0)
        osfcls(errctx.errcxfp);
	
	/* close the command and log files, if open */
	close_log_files();

    /* successful completion */
    return(OSEXSUCC);
}